

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::OptionValue::parse
          (OptionValue *this,shared_ptr<const_cxxopts::OptionDetails> *details,string *text)

{
  element_type *peVar1;
  __shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::__shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,
             &details->super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>)
  ;
  ensure_value(this,(shared_ptr<const_cxxopts::OptionDetails> *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  this->m_count = this->m_count + 1;
  peVar1 = (this->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_Value[3])(peVar1,text);
  return;
}

Assistant:

void
        parse
                (
                        std::shared_ptr<const OptionDetails> details,
                        const std::string& text
                )
        {
            ensure_value(details);
            ++m_count;
            m_value->parse(text);
        }